

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
          (basic_appender<char> out,write_int_arg<unsigned___int128> arg,format_specs *specs)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  uint uVar1;
  char *begin;
  basic_appender<char> bVar2;
  uint uVar3;
  int iVar4;
  uint in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  size_padding sp;
  char buffer [128];
  char local_38 [8];
  
  iVar4 = arg.abs_value._8_4_;
  switch((specs->super_basic_specs).data_ & 7) {
  case 4:
    value._4_4_ = in_stack_ffffffffffffff2c;
    value._0_4_ = in_stack_ffffffffffffff28;
    value._8_8_ = in_stack_ffffffffffffff30;
    begin = do_format_base2e<char,unsigned__int128>
                      ((detail *)0x4,(int)buffer,(char *)arg.abs_value,(unsigned___int128)value,
                       iVar4,true);
    uVar3 = (specs->super_basic_specs).data_;
    if ((uVar3 >> 0xd & 1) == 0) goto LAB_00321cb7;
    uVar3 = (uint)((uVar3 >> 0xc & 1) == 0) << 0xd | 0x5830;
    break;
  case 5:
    value_01._4_4_ = in_stack_ffffffffffffff2c;
    value_01._0_4_ = in_stack_ffffffffffffff28;
    value_01._8_8_ = in_stack_ffffffffffffff30;
    begin = do_format_base2e<char,unsigned__int128>
                      ((detail *)0x3,(int)buffer,(char *)arg.abs_value,(unsigned___int128)value_01,
                       iVar4,true);
    if ((((specs->super_basic_specs).data_ & 0x2000) != 0) &&
       (((char *)arg.abs_value != (char *)0x0 || arg.abs_value._8_8_ != 0) &&
        (long)specs->precision <= (long)(local_38 + -(long)begin))) {
      uVar3 = 0x3000;
      if (arg.prefix == 0) {
        uVar3 = 0x30;
      }
      arg.prefix = (uVar3 | arg.prefix) + 0x1000000;
    }
    goto LAB_00321cb7;
  case 6:
    value_00._4_4_ = in_stack_ffffffffffffff2c;
    value_00._0_4_ = in_stack_ffffffffffffff28;
    value_00._8_8_ = in_stack_ffffffffffffff30;
    begin = do_format_base2e<char,unsigned__int128>
                      ((detail *)0x1,(int)buffer,(char *)arg.abs_value,(unsigned___int128)value_00,
                       iVar4,true);
    uVar3 = (specs->super_basic_specs).data_;
    if ((uVar3 >> 0xd & 1) == 0) goto LAB_00321cb7;
    uVar3 = (uint)((uVar3 >> 0xc & 1) == 0) << 0xd | 0x4230;
    break;
  case 7:
    bVar2 = write_char<char,fmt::v11::basic_appender<char>>(out,(char)arg.abs_value,specs);
    return (basic_appender<char>)bVar2.container;
  default:
    value_02._4_4_ = in_stack_ffffffffffffff2c;
    value_02._0_4_ = in_stack_ffffffffffffff28;
    value_02._8_8_ = in_stack_ffffffffffffff30;
    begin = do_format_decimal<char,unsigned__int128>
                      ((detail *)buffer,(char *)arg.abs_value,(unsigned___int128)value_02,iVar4);
    goto LAB_00321cb7;
  }
  uVar1 = uVar3 << 8;
  if (arg.prefix == 0) {
    uVar1 = uVar3;
  }
  arg.prefix = (uVar1 | arg.prefix) + 0x2000000;
LAB_00321cb7:
  iVar4 = (int)local_38 - (int)begin;
  if (specs->precision == -1 && specs->width == 0) {
    bVar2 = reserve<char>(out,(ulong)((arg.prefix >> 0x18) + iVar4));
    for (uVar3 = arg.prefix & 0xffffff; uVar3 != 0; uVar3 = uVar3 >> 8) {
      basic_appender<char>::operator=((basic_appender<char> *)&stack0xffffffffffffff28,(char)uVar3);
    }
    buffer<char>::append<char>(bVar2.container,begin,local_38);
  }
  else {
    size_padding::size_padding(&sp,iVar4,arg.prefix,specs);
    bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned__int128>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned__int128>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                      (out,specs,(ulong)sp.size,(anon_class_24_4_0fb5e8cf *)&stack0xffffffffffffff28
                      );
  }
  return (basic_appender<char>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}